

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_process_args(int *argc,char **argv,zt_opt_def_t *args,zt_opt_validate validate,
                       zt_opt_error error)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  code *in_RCX;
  char *pcVar7;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  code *in_R8;
  bool bVar8;
  int consumed;
  int long_opt;
  int found;
  int combined_opt;
  char *p;
  size_t len;
  uint x;
  int i;
  size_t local_80;
  code *local_68;
  code *local_60;
  char *local_48;
  size_t local_40;
  uint local_38;
  int local_34;
  
  local_60 = in_R8;
  if (in_R8 == (code *)0x0) {
    local_60 = _zt_opt_error_wrapper;
  }
  local_68 = in_RCX;
  if (in_RCX == (code *)0x0) {
    local_68 = zt_opt_validate_default;
  }
  (*local_68)(in_RDX,local_60);
  local_34 = 1;
  do {
    if ((*in_RDI <= local_34) || (**(char **)(in_RSI + (long)local_34 * 8) != '-')) {
      *in_RDI = local_34;
      return 0;
    }
    local_40 = 0;
    lVar2 = *(long *)(in_RSI + (long)local_34 * 8);
    local_48 = (char *)(lVar2 + 1);
    bVar8 = false;
    bVar4 = false;
    bVar3 = false;
    if (*local_48 == '-') {
      bVar3 = true;
      local_48 = (char *)(lVar2 + 2);
      local_40 = 0;
      while( true ) {
        bVar8 = false;
        if (local_48[local_40] != '\0') {
          bVar8 = local_48[local_40] != '=';
        }
        if (!bVar8) break;
        local_40 = local_40 + 1;
      }
      bVar8 = local_48[local_40] == '=';
    }
    do {
      local_38 = 0;
      while( true ) {
        if (*(long *)(in_RDX + (ulong)local_38 * 0x30 + 0x18) == 0) goto LAB_00105b0c;
        if ((((local_40 == 0) && (*(char *)(in_RDX + (ulong)local_38 * 0x30) != -1)) &&
            (*local_48 == *(char *)(in_RDX + (ulong)local_38 * 0x30))) ||
           (((*(long *)(in_RDX + (ulong)local_38 * 0x30 + 8) != 0 &&
             (sVar6 = strlen(*(char **)(in_RDX + (ulong)local_38 * 0x30 + 8)), sVar6 == local_40))
            && (iVar5 = strncmp(local_48,*(char **)(in_RDX + (ulong)local_38 * 0x30 + 8),local_40),
               iVar5 == 0)))) break;
        local_38 = local_38 + 1;
      }
      bVar4 = true;
      iVar5 = (**(code **)(in_RDX + (ulong)local_38 * 0x30 + 0x18))
                        (local_34,local_38,in_RDI,in_RSI,in_RDX,local_60);
      if (iVar5 < 0) {
        return iVar5;
      }
      if (!bVar8) {
        local_34 = iVar5 + local_34;
      }
    } while (((iVar5 == 0) && (!bVar3)) &&
            (pcVar7 = local_48 + 1, pcVar1 = local_48 + 1, local_48 = pcVar7, *pcVar1 != '\0'));
LAB_00105b0c:
    if (!bVar4) {
      if (local_40 == 0) {
        local_80 = 1;
      }
      else {
        local_80 = local_40;
      }
      (*local_60)(0x16,"\'%.*s\'",local_80,local_48);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int
zt_opt_process_args(int * argc, char ** argv, zt_opt_def_t * args, zt_opt_validate validate, zt_opt_error error) {
    int i;

    error    = error ? error : _zt_opt_error_wrapper;
    validate = validate ? validate : zt_opt_validate_default;

    validate(args, error);

    for (i = 1; i < *argc; i++) {
        if (argv[i][0] == '-') {
            unsigned int x;
            size_t       len          = 0;
            char       * p            = &argv[i][1];
            int          combined_opt = 0;
            int          found        = 0;
            int          long_opt     = 0;

            if (*p == '-') { /* long opt */
                long_opt = 1;
                ++p;
                for (len = 0; p[len] != '\0' && p[len] != '='; len++) {
                    ;
                }

                if (p[len] == '=') {
                    combined_opt = 1;
                }
            }


AGAIN:
            for (x = 0; args[x].cb; x++) {
                if ((len == 0 && args[x].sopt != ZT_OPT_NSO && *p == args[x].sopt) || /* short opt */
                    /* long opt */
                    (args[x].lopt != ZT_OPT_NLO && strlen(args[x].lopt) == len &&
                     strncmp(p, args[x].lopt, len) == 0)) {
                    int consumed = 0;

                    found = 1;
                    if ((consumed = args[x].cb(i, x, argc, argv, args, error)) < 0) {
                        /* error */
                        return consumed;
                    }

                    if (!combined_opt) {
                        i += consumed;
                    }

                    if(!consumed && !long_opt && *(++p)) {
                        /* if we did not consume extra args AND
                         * we are a short option AND
                         * there are more short options to consume
                         */
                        goto AGAIN;
                    }

                    break;
                }
            }

            if (!found) {
                error(EINVAL, "'%.*s'", len ? len : 1, p);
            }
        } else {
            break;
        }
    }

    *argc = i;

    return 0;
}